

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void imul_GvEvIv(PDISASM pMyDisasm)

{
  int iVar1;
  Int32 IVar2;
  PDISASM pMyDisasm_local;
  
  (pMyDisasm->Instruction).Category = 0x10002;
  strcpy((pMyDisasm->Instruction).Mnemonic,"imul");
  if ((pMyDisasm->Reserved_).OperandSize < 0x20) {
    (pMyDisasm->Reserved_).MemDecoration = 0x66;
    (pMyDisasm->Reserved_).ImmediatSize = 0x10;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Reserved_).EIP_ =
         (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
    iVar1 = Security(2,pMyDisasm);
    if (iVar1 != 0) {
      (pMyDisasm->Instruction).Immediat = (ulong)*(ushort *)(pMyDisasm->Reserved_).EIP_;
      CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand3).OpMnemonic,"%.4X",
                          (ulong)*(ushort *)(pMyDisasm->Reserved_).EIP_);
      (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 2;
      (pMyDisasm->Operand3).OpType = 0x8040000;
      (pMyDisasm->Operand3).OpSize = 0x10;
      FillFlags(pMyDisasm,0x26);
    }
  }
  else {
    IVar2 = 0x67;
    if ((pMyDisasm->Reserved_).OperandSize == 0x40) {
      IVar2 = 0x68;
    }
    (pMyDisasm->Reserved_).MemDecoration = IVar2;
    (pMyDisasm->Reserved_).ImmediatSize = 0x20;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Operand1).AccessMode = 3;
    (pMyDisasm->Reserved_).EIP_ =
         (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
    iVar1 = Security(4,pMyDisasm);
    if (iVar1 != 0) {
      (pMyDisasm->Instruction).Immediat = (ulong)*(uint *)(pMyDisasm->Reserved_).EIP_;
      CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand3).OpMnemonic,"%.8X",
                          (ulong)*(uint *)(pMyDisasm->Reserved_).EIP_);
      (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 4;
      (pMyDisasm->Operand3).OpType = 0x8040000;
      (pMyDisasm->Operand3).OpSize = 0x20;
      FillFlags(pMyDisasm,0x26);
    }
  }
  return;
}

Assistant:

void __bea_callspec__ imul_GvEvIv(PDISASM pMyDisasm)
{
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "imul");
    #endif
    if (GV.OperandSize >= 32) {
      GV.MemDecoration = (GV.OperandSize == 64) ? Arg2qword : Arg2dword;
      GV.ImmediatSize = 32;
      decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
      decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
      pMyDisasm->Operand1.AccessMode = READ + WRITE;

      GV.EIP_+= GV.DECALAGE_EIP+2;
      if (!Security(4, pMyDisasm)) return;
      pMyDisasm->Instruction.Immediat = *((UInt32*) (GV.EIP_- 0));
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand3.OpMnemonic, "%.8X",(Int64) *((UInt32*) (GV.EIP_- 0)));
      #endif
      GV.EIP_+=4;
      pMyDisasm->Operand3.OpType = CONSTANT_TYPE+ABSOLUTE_;
      pMyDisasm->Operand3.OpSize = 32;

      FillFlags(pMyDisasm, 38);
    }
    else {
      GV.MemDecoration = Arg2word;
      GV.ImmediatSize = 16;
      decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
      decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
      GV.EIP_+= GV.DECALAGE_EIP+2;
      if (!Security(2, pMyDisasm)) return;
      pMyDisasm->Instruction.Immediat = *((UInt16*) (GV.EIP_- 0));
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand3.OpMnemonic, "%.4X",(Int64) *((UInt16*) (GV.EIP_- 0)));
      #endif
      GV.EIP_+=2;
      pMyDisasm->Operand3.OpType = CONSTANT_TYPE+ABSOLUTE_;
      pMyDisasm->Operand3.OpSize = 16;

      FillFlags(pMyDisasm, 38);
    }
}